

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_send(nng_socket s,void *buf,size_t len,int flags)

{
  void *__dest;
  nng_msg *pnStack_30;
  int rv;
  nng_msg *msg;
  size_t sStack_20;
  int flags_local;
  size_t len_local;
  void *buf_local;
  nng_socket s_local;
  
  msg._4_4_ = flags;
  sStack_20 = len;
  len_local = (size_t)buf;
  buf_local._0_4_ = s.id;
  buf_local._4_4_ = nng_msg_alloc(&stack0xffffffffffffffd0,len);
  if (buf_local._4_4_ == 0) {
    __dest = nng_msg_body(pnStack_30);
    memcpy(__dest,(void *)len_local,sStack_20);
    buf_local._4_4_ = nng_sendmsg(buf_local._0_4_,pnStack_30,msg._4_4_);
    if (buf_local._4_4_ != 0) {
      nng_msg_free(pnStack_30);
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
nng_send(nng_socket s, void *buf, size_t len, int flags)
{
	nng_msg *msg;
	int      rv;

	if ((rv = nng_msg_alloc(&msg, len)) != 0) {
		return (rv);
	}
	memcpy(nng_msg_body(msg), buf, len);
	if ((rv = nng_sendmsg(s, msg, flags)) != 0) {
		// If nng_sendmsg() succeeded, then it took ownership.
		nng_msg_free(msg);
	}
	return (rv);
}